

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O3

void __thiscall PRED<UF>::PerformLabeling(PRED<UF> *this)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  int *piVar6;
  Mat1b *pMVar7;
  long lVar8;
  long *plVar9;
  Mat1i *pMVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint *puVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  uint *puVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int local_118;
  long local_110;
  long local_100;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar6 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar6,piVar6[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar14 = (uint *)operator_new__((ulong)(((*(int *)&pMVar7->field_0xc -
                                            (*(int *)&pMVar7->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                           ((*(int *)&pMVar7->field_0x8 -
                                            (*(int *)&pMVar7->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1)
                                   << 2);
  UF::P_ = puVar14;
  *puVar14 = 0;
  UF::length_ = 1;
  iVar30 = *(int *)&pMVar7->field_0xc;
  lVar31 = (long)iVar30;
  uVar23 = *(uint *)&pMVar7->field_0x8;
  lVar8 = *(long *)&pMVar7->field_0x10;
  plVar9 = *(long **)&pMVar7->field_0x48;
  pMVar10 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar20 = *(long *)&pMVar10->field_0x10;
  plVar11 = *(long **)&pMVar10->field_0x48;
  if (0 < lVar31) {
    uVar24 = 0;
    do {
      iVar17 = (int)uVar24;
      if (*(char *)(lVar8 + iVar17) != '\0') {
        puVar14[UF::length_] = UF::length_;
        uVar15 = UF::length_ + 1;
        *(uint *)(lVar20 + (long)iVar17 * 4) = UF::length_;
        UF::length_ = uVar15;
        if (iVar30 <= iVar17 + 1) break;
        uVar24 = (ulong)(iVar17 + 1);
        while (*(char *)(lVar8 + uVar24) != '\0') {
          *(undefined4 *)(lVar20 + uVar24 * 4) =
               *(undefined4 *)(lVar20 + (long)((int)uVar24 + -1) * 4);
          uVar24 = uVar24 + 1;
          if (iVar30 == (int)uVar24) goto LAB_001a06b6;
        }
      }
      uVar15 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar15;
    } while ((int)uVar15 < iVar30);
  }
LAB_001a06b6:
  if (1 < (int)uVar23) {
    lVar12 = *plVar9;
    lVar13 = *plVar11;
    lVar28 = lVar31 + -1;
    lVar21 = lVar12 + 1 + lVar8;
    local_100 = lVar20 + 4;
    uVar24 = 1;
    lVar29 = lVar8;
    lVar33 = lVar20;
    local_110 = lVar20;
    do {
      local_100 = local_100 + lVar13;
      local_110 = local_110 + lVar13;
      lVar2 = lVar8 + lVar12 * uVar24;
      pcVar3 = (char *)(lVar2 - lVar12);
      puVar32 = (uint *)(lVar13 * uVar24 + lVar20);
      puVar25 = (uint *)((long)puVar32 - lVar13);
      cVar5 = *(char *)(lVar8 + lVar12 * uVar24);
      local_118 = (int)lVar28;
      if (local_118 == 0) {
        if (cVar5 != '\0') {
          if (*pcVar3 == '\0') {
            puVar14[UF::length_] = UF::length_;
            uVar15 = UF::length_ + 1;
            *puVar32 = UF::length_;
            UF::length_ = uVar15;
          }
          else {
            *puVar32 = *puVar25;
          }
        }
      }
      else {
        lVar18 = lVar28;
        if (cVar5 == '\0') {
          uVar27 = 0;
          goto LAB_001a081e;
        }
        if (*pcVar3 == '\0') {
          if (pcVar3[1] == '\0') {
            puVar14[UF::length_] = UF::length_;
            uVar15 = UF::length_ + 1;
            *puVar32 = UF::length_;
            UF::length_ = uVar15;
            iVar30 = 0;
            goto LAB_001a0a35;
          }
          *puVar32 = puVar25[1];
          uVar27 = 0;
          goto LAB_001a0b5d;
        }
        *puVar32 = *puVar25;
        uVar27 = 0;
LAB_001a0b94:
        iVar30 = (int)uVar27;
        if (iVar30 + 1 < local_118) {
          lVar26 = (long)iVar30;
          lVar19 = local_100 + lVar26 * 4;
          lVar36 = 0;
          while( true ) {
            if (*(char *)(lVar21 + lVar26 + lVar36) == '\0') {
              uVar15 = (int)(lVar26 + 1) + (int)lVar36;
              goto LAB_001a0c77;
            }
            if (*(char *)(lVar29 + lVar26 + 1 + lVar36) == '\0') break;
            *(undefined4 *)(lVar19 + lVar36 * 4) =
                 *(undefined4 *)(lVar26 * 4 + lVar33 + 4 + lVar36 * 4);
            lVar36 = lVar36 + 1;
            if ((lVar26 - lVar31) + 2 + lVar36 == 0) {
              iVar30 = iVar30 + (int)lVar36;
              goto LAB_001a0c53;
            }
          }
          uVar27 = lVar26 + 1 + lVar36;
          iVar30 = iVar30 + (int)lVar36;
          iVar17 = iVar30 + 2;
          if (pcVar3[iVar17] == '\0') {
            *(uint *)(lVar19 + lVar36 * 4) = puVar32[iVar30];
            iVar30 = (int)uVar27;
            goto LAB_001a0a35;
          }
          uVar15 = puVar32[iVar30];
          do {
            uVar22 = uVar15;
            uVar16 = puVar25[iVar17];
            uVar15 = puVar14[uVar22];
          } while (puVar14[uVar22] < uVar22);
          do {
            uVar15 = uVar16;
            uVar16 = puVar14[uVar15];
          } while (puVar14[uVar15] < uVar15);
          if (uVar22 < uVar15) {
            puVar14[uVar15] = uVar22;
            uVar15 = uVar22;
          }
          else {
            puVar14[uVar22] = uVar15;
          }
          *(uint *)(lVar19 + lVar36 * 4) = uVar15;
LAB_001a0b5d:
          lVar19 = (long)(int)uVar27;
          uVar27 = lVar19 + 1;
          cVar5 = *(char *)(lVar2 + 1 + lVar19);
          if (local_118 <= (int)uVar27) {
            if (cVar5 != '\0') {
              puVar32[lVar19 + 1] = puVar25[lVar19 + 1];
            }
            goto LAB_001a0cf2;
          }
          if (cVar5 == '\0') {
LAB_001a081e:
            lVar36 = (long)(int)uVar27;
            lVar19 = 0;
            lVar26 = lVar36 << 0x20;
            do {
              lVar35 = lVar26;
              lVar34 = lVar35 >> 0x20;
              if (lVar28 <= lVar36 + lVar19 + 1) {
                lVar18 = lVar35 + 0x100000000 >> 0x20;
                if (*(char *)(lVar2 + lVar18) == '\0') goto LAB_001a0cf2;
                if (pcVar3[lVar18] != '\0') goto LAB_001a0c6a;
                if (pcVar3[lVar34] == '\0') {
                  puVar14[UF::length_] = UF::length_;
                  uVar15 = UF::length_ + 1;
                  puVar32[lVar18] = UF::length_;
                  UF::length_ = uVar15;
                  goto LAB_001a0cf2;
                }
                uVar15 = puVar25[lVar34];
                goto LAB_001a0cee;
              }
              lVar1 = lVar19 + 1;
              pcVar4 = (char *)(lVar21 + lVar36 + lVar19);
              lVar19 = lVar1;
              lVar26 = lVar35 + 0x100000000;
            } while (*pcVar4 == '\0');
            uVar27 = (uVar27 & 0xffffffff) + lVar1;
            iVar30 = (int)uVar27;
            if (*(char *)(lVar1 + lVar29 + lVar36) != '\0') {
              *(undefined4 *)(local_110 + lVar36 * 4 + lVar1 * 4) =
                   *(undefined4 *)(lVar36 * 4 + lVar33 + lVar1 * 4);
              uVar27 = uVar27 & 0xffffffff;
              goto LAB_001a0b94;
            }
            lVar19 = lVar35 + 0x200000000 >> 0x20;
            if (pcVar3[lVar19] == '\0') {
              if (pcVar3[lVar34] == '\0') {
                puVar14[UF::length_] = UF::length_;
                uVar15 = UF::length_ + 1;
                *(uint *)(local_110 + lVar36 * 4 + lVar1 * 4) = UF::length_;
                UF::length_ = uVar15;
              }
              else {
                *(uint *)(local_110 + lVar36 * 4 + lVar1 * 4) = puVar25[lVar34];
              }
LAB_001a0a35:
              if (local_118 <= iVar30 + 1) {
                lVar18 = (long)(iVar30 + 1);
LAB_001a0ad2:
                if (*(char *)(lVar2 + lVar18) != '\0') goto LAB_001a0cea;
                goto LAB_001a0cf2;
              }
              lVar26 = (long)iVar30;
              lVar35 = lVar26 << 0x20;
              lVar19 = local_100 + lVar26 * 4;
              lVar36 = 0;
              while( true ) {
                if (*(char *)(lVar21 + lVar26 + lVar36) == '\0') goto LAB_001a0ae5;
                if (*(char *)(lVar29 + lVar26 + 2 + lVar36) != '\0') break;
                *(undefined4 *)(lVar19 + lVar36 * 4) = *(undefined4 *)(lVar19 + -4 + lVar36 * 4);
                lVar35 = lVar35 + 0x100000000;
                lVar36 = lVar36 + 1;
                if ((lVar31 + -2) - lVar26 == lVar36) {
                  iVar30 = iVar30 + (int)lVar36;
                  goto LAB_001a0ad2;
                }
              }
              uVar15 = *(uint *)((long)puVar32 + (lVar35 >> 0x1e));
              do {
                uVar22 = uVar15;
                uVar15 = puVar14[uVar22];
              } while (puVar14[uVar22] < uVar22);
              uVar27 = lVar26 + 1 + lVar36;
              uVar15 = *(uint *)(lVar26 * 4 + lVar33 + 8 + lVar36 * 4);
              do {
                uVar16 = uVar15;
                uVar15 = puVar14[uVar16];
              } while (puVar14[uVar16] < uVar16);
              if (uVar22 < uVar16) {
                puVar14[uVar16] = uVar22;
                uVar16 = uVar22;
              }
              else {
                puVar14[uVar22] = uVar16;
              }
              *(uint *)(lVar19 + lVar36 * 4) = uVar16;
            }
            else if (pcVar3[lVar34] == '\0') {
              *(uint *)(local_110 + lVar36 * 4 + lVar1 * 4) = puVar25[lVar19];
            }
            else {
              uVar15 = puVar25[lVar34];
              do {
                uVar16 = uVar15;
                uVar15 = puVar14[uVar16];
                uVar22 = puVar25[lVar19];
              } while (puVar14[uVar16] < uVar16);
              do {
                uVar15 = uVar22;
                uVar22 = puVar14[uVar15];
              } while (puVar14[uVar15] < uVar15);
              if (uVar16 < uVar15) {
                puVar14[uVar15] = uVar16;
                uVar15 = uVar16;
              }
              else {
                puVar14[uVar16] = uVar15;
              }
              *(uint *)(local_110 + lVar36 * 4 + lVar1 * 4) = uVar15;
            }
            goto LAB_001a0b5d;
          }
          puVar32[lVar19 + 1] = puVar25[lVar19 + 1];
          goto LAB_001a0b94;
        }
        lVar18 = (long)(iVar30 + 1);
LAB_001a0c53:
        if (*(char *)(lVar2 + lVar18) != '\0') {
          if (pcVar3[lVar18] == '\0') {
LAB_001a0cea:
            uVar15 = puVar32[iVar30];
          }
          else {
LAB_001a0c6a:
            uVar15 = puVar25[lVar18];
          }
LAB_001a0cee:
          puVar32[lVar18] = uVar15;
        }
      }
LAB_001a0cf2:
      uVar24 = uVar24 + 1;
      lVar33 = lVar33 + lVar13;
      lVar29 = lVar29 + lVar12;
      lVar21 = lVar21 + lVar12;
    } while (uVar24 != uVar23);
  }
  uVar24 = (ulong)UF::length_;
  uVar23 = 1;
  if (1 < uVar24) {
    uVar23 = 1;
    uVar27 = 1;
    do {
      if (puVar14[uVar27] < uVar27) {
        uVar15 = puVar14[puVar14[uVar27]];
      }
      else {
        uVar15 = uVar23;
        uVar23 = uVar23 + 1;
      }
      puVar14[uVar27] = uVar15;
      uVar27 = uVar27 + 1;
    } while (uVar24 != uVar27);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar23;
  iVar30 = *(int *)&pMVar10->field_0x8;
  if (0 < iVar30) {
    lVar8 = *plVar11;
    lVar31 = 0;
    do {
      iVar17 = *(int *)&pMVar10->field_0xc;
      if ((long)iVar17 != 0) {
        lVar28 = 0;
        do {
          *(uint *)(lVar20 + lVar28) = puVar14[*(uint *)(lVar20 + lVar28)];
          lVar28 = lVar28 + 4;
        } while ((long)iVar17 * 4 != lVar28);
        iVar30 = *(int *)&pMVar10->field_0x8;
      }
      lVar31 = lVar31 + 1;
      lVar20 = lVar20 + lVar8;
    } while (lVar31 < iVar30);
  }
  operator_delete__(puVar14);
  return;
LAB_001a0ae5:
  uVar15 = (int)(lVar26 + 1) + (int)lVar36;
LAB_001a0c77:
  uVar27 = (ulong)uVar15;
  goto LAB_001a081e;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }